

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

TCGv_i32 neon_get_scalar(TCGContext_conflict1 *tcg_ctx,int size,int reg)

{
  TCGv_i32 pTVar1;
  TCGv_i32 ret;
  TCGv_i32 tmp;
  
  if (size == 1) {
    pTVar1 = neon_load_reg(tcg_ctx,reg & 7,(uint)reg >> 4);
    ret = tcg_temp_new_i32(tcg_ctx);
    if ((reg & 8U) == 0) {
      tcg_gen_ext16u_i32_aarch64(tcg_ctx,pTVar1,pTVar1);
      tcg_gen_shli_i32_aarch64(tcg_ctx,ret,pTVar1,0x10);
    }
    else {
      tcg_gen_andi_i32_aarch64(tcg_ctx,pTVar1,pTVar1,-0x10000);
      tcg_gen_shri_i32_aarch64(tcg_ctx,ret,pTVar1,0x10);
    }
    tcg_gen_or_i32(tcg_ctx,pTVar1,pTVar1,ret);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)&tcg_ctx->pool_cur));
    return pTVar1;
  }
  pTVar1 = neon_load_reg(tcg_ctx,reg & 0xf,(uint)reg >> 4);
  return pTVar1;
}

Assistant:

static inline TCGv_i32 neon_get_scalar(TCGContext *tcg_ctx, int size, int reg)
{
    TCGv_i32 tmp;
    if (size == 1) {
        tmp = neon_load_reg(tcg_ctx, reg & 7, reg >> 4);
        if (reg & 8) {
            gen_neon_dup_high16(tcg_ctx, tmp);
        } else {
            gen_neon_dup_low16(tcg_ctx, tmp);
        }
    } else {
        tmp = neon_load_reg(tcg_ctx, reg & 15, reg >> 4);
    }
    return tmp;
}